

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexCompileTime.cpp
# Opt level: O2

void __thiscall UnifiedRegex::LoopNode::Emit(LoopNode *this,Compiler *compiler,CharCount *skipped)

{
  uint uVar1;
  uint uVar2;
  CharCount CVar3;
  undefined4 uVar4;
  size_t sVar5;
  CountDomain CVar6;
  code *pcVar7;
  bool bVar8;
  char16 cVar9;
  uint uVar10;
  int iVar11;
  Label LVar12;
  undefined4 *puVar13;
  uint8 *puVar14;
  Node *pNVar15;
  Node *pNVar16;
  BeginLoopIfSetInst *this_00;
  byte *pbVar17;
  ChompSetInst<(UnifiedRegex::ChompMode)1> *this_01;
  MatchSetOrJumpInst *this_02;
  LoopSetWithFollowFirstInst *this_03;
  ChompSetBoundedInst *this_04;
  TryMatchSetInst *this_05;
  TryIfSetInst *this_06;
  CharCount CVar18;
  Label LVar19;
  CharSet<char16_t> *other;
  ArenaAllocator *allocator;
  RuntimeCharSet<char16_t> *this_07;
  Label *pLabel;
  TryMixin *pLabel_00;
  int local_3c;
  CharCount local_38;
  int maxBodyGroupId;
  int minBodyGroupId;
  
  ThreadContext::ProbeStackNoDispose
            (compiler->scriptContext->threadContext,0x6000,compiler->scriptContext,(PVOID)0x0);
  if (*skipped != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar13 = 1;
    bVar8 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                       ,0xf49,"(skipped == 0)","skipped == 0");
    if (!bVar8) goto LAB_00d16c34;
    *puVar13 = 0;
  }
  switch(this->scheme) {
  case BeginEnd:
    local_3c = -1;
    maxBodyGroupId = (int)compiler->program->numGroups;
    (*this->body->_vptr_Node[0x10])(this->body,compiler->scriptContext,&maxBodyGroupId,&local_3c);
    local_38 = compiler->instNext;
    puVar14 = Compiler::Emit(compiler,0x1c);
    iVar11 = compiler->nextLoopId;
    compiler->nextLoopId = iVar11 + 1;
    uVar2 = *(uint *)&(this->super_Node).field_0xc;
    uVar1 = *(uint *)&this->body->field_0xc;
    bVar8 = this->isGreedy;
    *puVar14 = 'D';
    *(int *)(puVar14 + 1) = iVar11;
    CVar6 = this->repeats;
    puVar14[0xd] = (uVar2 >> 10 & 1) == 0;
    *(CountDomain *)(puVar14 + 5) = CVar6;
    puVar14[0xe] = (uVar1 >> 9 & 1) == 0;
    puVar14[0xf] = 0xff;
    puVar14[0x10] = 0xff;
    puVar14[0x11] = 0xff;
    puVar14[0x12] = 0xff;
    *(int *)(puVar14 + 0x13) = maxBodyGroupId;
    *(int *)(puVar14 + 0x17) = local_3c;
    puVar14[0x1b] = bVar8;
    LVar12 = Compiler::GetFixup(compiler,(Label *)(puVar14 + 0xf));
    (*this->body->_vptr_Node[0x11])(this->body,compiler,skipped);
    puVar14 = Compiler::Emit(compiler,5);
    *puVar14 = 'E';
    *(CharCount *)(puVar14 + 1) = local_38;
    goto LAB_00d169ba;
  default:
    goto switchD_00d15d5b_caseD_1;
  case Chomp:
    uVar2 = (this->repeats).lower;
    bVar8 = (this->repeats).upper != 0xffffffff;
    if ((this->body->firstSet->rep).compact.countPlusOne == 2) {
      if (bVar8 || 1 < uVar2) {
        puVar14 = Compiler::Emit(compiler,0xb);
        cVar9 = CharSet<char16_t>::Singleton(this->body->firstSet);
        *puVar14 = 'Z';
        *(char16 *)(puVar14 + 1) = cVar9;
        *(CountDomain *)(puVar14 + 3) = this->repeats;
        return;
      }
      puVar14 = Compiler::Emit(compiler,3);
      cVar9 = CharSet<char16_t>::Singleton(this->body->firstSet);
      if (uVar2 == 0) {
        *puVar14 = 'R';
      }
      else {
        *puVar14 = 'S';
      }
LAB_00d168ed:
      *(char16 *)(puVar14 + 1) = cVar9;
      return;
    }
    if (bVar8 || 1 < uVar2) {
      this_04 = (ChompSetBoundedInst *)Compiler::Emit(compiler,0x31);
      ChompSetBoundedInst::ChompSetBoundedInst(this_04,&this->repeats);
      this_07 = &(this_04->super_SetMixin<false>).set;
      allocator = compiler->rtAllocator;
      other = this->body->firstSet;
      goto LAB_00d16a92;
    }
    this_01 = (ChompSetInst<(UnifiedRegex::ChompMode)1> *)Compiler::Emit(compiler,0x29);
    this_07 = &(this_01->super_SetMixin<false>).set;
    if (uVar2 == 0) {
      ChompSetInst<(UnifiedRegex::ChompMode)0>::ChompSetInst
                ((ChompSetInst<(UnifiedRegex::ChompMode)0> *)this_01);
    }
    else {
      ChompSetInst<(UnifiedRegex::ChompMode)1>::ChompSetInst(this_01);
    }
    goto LAB_00d16a83;
  case ChompGroupLastChar:
    pNVar15 = this->body;
    if (pNVar15->tag != DefineGroup) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xf91,"(body->tag == DefineGroup)","body->tag == DefineGroup");
      if (!bVar8) {
LAB_00d16c34:
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      *puVar13 = 0;
      pNVar15 = this->body;
    }
    this_03 = (LoopSetWithFollowFirstInst *)Compiler::Emit(compiler,0x36);
    iVar11._0_2_ = pNVar15[1].tag;
    iVar11._2_2_ = pNVar15[1].features;
    ChompSetBoundedGroupLastCharInst::ChompSetBoundedGroupLastCharInst
              ((ChompSetBoundedGroupLastCharInst *)this_03,&this->repeats,iVar11,this->noNeedToSave)
    ;
    break;
  case Guarded:
    local_3c = -1;
    maxBodyGroupId = (int)compiler->program->numGroups;
    (*this->body->_vptr_Node[0x10])(this->body,compiler->scriptContext);
    CVar18 = compiler->instNext;
    if ((this->body->firstSet->rep).compact.countPlusOne == 2) {
      puVar14 = Compiler::Emit(compiler,0x1d);
      local_38 = CVar18;
      cVar9 = CharSet<char16_t>::Singleton(this->body->firstSet);
      iVar11 = compiler->nextLoopId;
      compiler->nextLoopId = iVar11 + 1;
      uVar2 = *(uint *)&(this->super_Node).field_0xc;
      uVar1 = *(uint *)&this->body->field_0xc;
      *puVar14 = 'F';
      *(char16 *)(puVar14 + 1) = cVar9;
      *(int *)(puVar14 + 3) = iVar11;
      CVar6 = this->repeats;
      puVar14[0xf] = (uVar2 >> 10 & 1) == 0;
      *(CountDomain *)(puVar14 + 7) = CVar6;
      puVar14[0x10] = (uVar1 >> 9 & 1) == 0;
      puVar14[0x11] = 0xff;
      puVar14[0x12] = 0xff;
      puVar14[0x13] = 0xff;
      puVar14[0x14] = 0xff;
      pLabel = (Label *)(puVar14 + 0x11);
      *(int *)(puVar14 + 0x15) = maxBodyGroupId;
      *(int *)(puVar14 + 0x19) = local_3c;
      CVar18 = local_38;
    }
    else {
      this_00 = (BeginLoopIfSetInst *)Compiler::Emit(compiler,0x43);
      iVar11 = compiler->nextLoopId;
      compiler->nextLoopId = iVar11 + 1;
      BeginLoopIfSetInst::BeginLoopIfSetInst
                (this_00,iVar11,&this->repeats,
                 (*(uint *)&(this->super_Node).field_0xc >> 10 & 1) == 0,
                 (*(uint *)&this->body->field_0xc >> 9 & 1) == 0,maxBodyGroupId,local_3c);
      RuntimeCharSet<char16_t>::CloneFrom
                (&(this_00->super_SetMixin<false>).set,compiler->rtAllocator,this->body->firstSet);
      pLabel = &(this_00->super_BeginLoopMixin).exitLabel;
    }
    LVar12 = Compiler::GetFixup(compiler,pLabel);
    (*this->body->_vptr_Node[0x11])(this->body,compiler,skipped);
    sVar5 = (this->body->firstSet->rep).compact.countPlusOne;
    pbVar17 = Compiler::Emit(compiler,5);
    *pbVar17 = sVar5 == 2 ^ 0x49;
    *(CharCount *)(pbVar17 + 1) = CVar18;
LAB_00d169ba:
    LVar19 = compiler->instNext;
LAB_00d16c0e:
    Compiler::DoFixup(compiler,LVar12,LVar19);
switchD_00d15d5b_caseD_1:
    return;
  case Fixed:
    pNVar15 = this->body;
    if ((pNVar15->features & 0x100) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfc1,"(!body->ContainsDefineGroup())","!body->ContainsDefineGroup()");
      if (!bVar8) goto LAB_00d16c34;
      *puVar13 = 0;
      pNVar15 = this->body;
    }
    CVar18 = (pNVar15->thisConsumes).lower;
    if (CVar18 != (pNVar15->thisConsumes).upper) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfc2,"(body->thisConsumes.IsFixed())","body->thisConsumes.IsFixed()");
      if (!bVar8) goto LAB_00d16c34;
      *puVar13 = 0;
      pNVar15 = this->body;
      CVar18 = (pNVar15->thisConsumes).lower;
    }
    if (CVar18 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfc3,"(body->thisConsumes.lower > 0)","body->thisConsumes.lower > 0");
      if (!bVar8) goto LAB_00d16c34;
      *puVar13 = 0;
      pNVar15 = this->body;
    }
    if ((pNVar15->field_0xd & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfc4,"(body->isDeterministic)","body->isDeterministic");
      if (!bVar8) goto LAB_00d16c34;
      *puVar13 = 0;
    }
    CVar18 = compiler->instNext;
    puVar14 = Compiler::Emit(compiler,0x17);
    iVar11 = compiler->nextLoopId;
    compiler->nextLoopId = iVar11 + 1;
    uVar2 = *(uint *)&(this->super_Node).field_0xc;
    CVar3 = (this->body->thisConsumes).lower;
    *puVar14 = 'J';
    *(int *)(puVar14 + 1) = iVar11;
    *(CountDomain *)(puVar14 + 5) = this->repeats;
    puVar14[0xd] = (uVar2 >> 10 & 1) == 0;
    puVar14[0xe] = '\0';
    puVar14[0xf] = 0xff;
    puVar14[0x10] = 0xff;
    puVar14[0x11] = 0xff;
    puVar14[0x12] = 0xff;
    *(CharCount *)(puVar14 + 0x13) = CVar3;
    LVar12 = Compiler::GetFixup(compiler,(Label *)(puVar14 + 0xf));
    (*this->body->_vptr_Node[0x11])(this->body,compiler,skipped);
    puVar14 = Compiler::Emit(compiler,5);
    *puVar14 = 'K';
    goto LAB_00d16773;
  case FixedSet:
    bVar8 = Node::IsSimpleOneChar(this->body);
    if (!bVar8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfd4,"(body->IsSimpleOneChar())","body->IsSimpleOneChar()");
      if (!bVar8) goto LAB_00d16c34;
      *puVar13 = 0;
    }
    if ((this->followFirst == L'\xffff') ||
       (bVar8 = Js::Phases::IsEnabled((Phases *)&DAT_01441eb0,RegexOptBTPhase), bVar8)) {
      this_03 = (LoopSetWithFollowFirstInst *)Compiler::Emit(compiler,0x36);
      iVar11 = compiler->nextLoopId;
      compiler->nextLoopId = iVar11 + 1;
      LoopSetInst::LoopSetInst
                ((LoopSetInst *)this_03,iVar11,&this->repeats,
                 (*(uint *)&(this->super_Node).field_0xc >> 10 & 1) == 0);
    }
    else {
      this_03 = (LoopSetWithFollowFirstInst *)Compiler::Emit(compiler,0x38);
      iVar11 = compiler->nextLoopId;
      compiler->nextLoopId = iVar11 + 1;
      LoopSetWithFollowFirstInst::LoopSetWithFollowFirstInst
                (this_03,iVar11,&this->repeats,
                 (*(uint *)&(this->super_Node).field_0xc >> 10 & 1) == 0,this->followFirst);
    }
    break;
  case FixedGroupLastIteration:
    pNVar15 = this->body;
    if (pNVar15->tag != DefineGroup) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfea,"(body->tag == DefineGroup)","body->tag == DefineGroup");
      if (!bVar8) goto LAB_00d16c34;
      *puVar13 = 0;
      pNVar15 = this->body;
    }
    CVar18 = (pNVar15->thisConsumes).lower;
    pNVar16 = pNVar15;
    if (CVar18 != (pNVar15->thisConsumes).upper) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfec,"(body->thisConsumes.IsFixed())","body->thisConsumes.IsFixed()");
      if (!bVar8) goto LAB_00d16c34;
      *puVar13 = 0;
      pNVar16 = this->body;
      CVar18 = (pNVar16->thisConsumes).lower;
    }
    if (CVar18 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfed,"(body->thisConsumes.lower > 0)","body->thisConsumes.lower > 0");
      if (!bVar8) goto LAB_00d16c34;
      *puVar13 = 0;
      pNVar16 = this->body;
    }
    if ((pNVar16->field_0xd & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0xfee,"(body->isDeterministic)","body->isDeterministic");
      if (!bVar8) goto LAB_00d16c34;
      *puVar13 = 0;
    }
    CVar18 = compiler->instNext;
    puVar14 = Compiler::Emit(compiler,0x1c);
    iVar11 = compiler->nextLoopId;
    compiler->nextLoopId = iVar11 + 1;
    uVar2 = *(uint *)&(this->super_Node).field_0xc;
    CVar3 = (this->body->thisConsumes).lower;
    uVar4 = *(undefined4 *)&pNVar15[1].tag;
    bVar8 = this->noNeedToSave;
    *puVar14 = 'N';
    *(int *)(puVar14 + 1) = iVar11;
    *(CountDomain *)(puVar14 + 5) = this->repeats;
    puVar14[0xd] = (uVar2 >> 10 & 1) == 0;
    puVar14[0xe] = '\0';
    puVar14[0xf] = 0xff;
    puVar14[0x10] = 0xff;
    puVar14[0x11] = 0xff;
    puVar14[0x12] = 0xff;
    *(CharCount *)(puVar14 + 0x13) = CVar3;
    *(undefined4 *)(puVar14 + 0x17) = uVar4;
    puVar14[0x1b] = bVar8;
    LVar12 = Compiler::GetFixup(compiler,(Label *)(puVar14 + 0xf));
    (**(code **)(*pNVar15[1]._vptr_Node + 0x88))(pNVar15[1]._vptr_Node,compiler,skipped);
    puVar14 = Compiler::Emit(compiler,5);
    *puVar14 = 'O';
    *(CharCount *)(puVar14 + 1) = CVar18;
    LVar19 = compiler->instNext;
    goto LAB_00d16780;
  case GreedyNoBacktrack:
    if ((this->body->features & 0x100) != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1001,"(!body->ContainsDefineGroup())","!body->ContainsDefineGroup()");
      if (!bVar8) goto LAB_00d16c34;
      *puVar13 = 0;
    }
    if (this->isGreedy == false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1002,"(isGreedy)","isGreedy");
      if (!bVar8) goto LAB_00d16c34;
      *puVar13 = 0;
    }
    if ((this->repeats).lower != 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1003,"(repeats.lower == 0)","repeats.lower == 0");
      if (!bVar8) goto LAB_00d16c34;
      *puVar13 = 0;
    }
    if ((this->repeats).upper != 0xffffffff) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1004,"(repeats.upper == CharCountFlag)","repeats.upper == CharCountFlag"
                        );
      if (!bVar8) goto LAB_00d16c34;
      *puVar13 = 0;
    }
    if ((this->body->field_0xd & 2) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1005,"(body->isDeterministic)","body->isDeterministic");
      if (!bVar8) goto LAB_00d16c34;
      *puVar13 = 0;
    }
    CVar18 = compiler->instNext;
    puVar14 = Compiler::Emit(compiler,9);
    iVar11 = compiler->nextLoopId;
    compiler->nextLoopId = iVar11 + 1;
    *puVar14 = 'P';
    *(int *)(puVar14 + 1) = iVar11;
    LVar12 = Compiler::GetFixup(compiler,(Label *)(puVar14 + 5));
    (*this->body->_vptr_Node[0x11])(this->body,compiler,skipped);
    puVar14 = Compiler::Emit(compiler,5);
    *puVar14 = 'Q';
LAB_00d16773:
    *(CharCount *)(puVar14 + 1) = CVar18;
    LVar19 = compiler->instNext;
LAB_00d16780:
    Compiler::DoFixup(compiler,LVar12,LVar19);
    return;
  case Set:
    pNVar15 = this->body;
    if (((pNVar15->features & 0x100) != 0) && ((pNVar15->thisConsumes).lower == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1015,
                         "(!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty())",
                         "!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty()");
      if (!bVar8) goto LAB_00d16c34;
      *puVar13 = 0;
      pNVar15 = this->body;
    }
    if ((pNVar15->firstSet->rep).compact.countPlusOne == 2) {
      puVar14 = Compiler::Emit(compiler,3);
      cVar9 = CharSet<char16_t>::Singleton(this->body->firstSet);
      *puVar14 = '#';
      goto LAB_00d168ed;
    }
    this_03 = (LoopSetWithFollowFirstInst *)Compiler::Emit(compiler,0x29);
    OptMatchSetInst::OptMatchSetInst((OptMatchSetInst *)this_03);
    break;
  case Chain:
    pNVar15 = this->body;
    if (((pNVar15->features & 0x100) != 0) && ((pNVar15->thisConsumes).lower == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1027,
                         "(!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty())",
                         "!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty()");
      if (!bVar8) goto LAB_00d16c34;
      *puVar13 = 0;
      pNVar15 = this->body;
    }
    maxBodyGroupId = 0;
    sVar5 = (pNVar15->firstSet->rep).compact.countPlusOne;
    iVar11 = (*pNVar15->_vptr_Node[0xb])(pNVar15,compiler);
    if (sVar5 == 2) {
      puVar14 = Compiler::Emit(compiler,7);
      cVar9 = CharSet<char16_t>::Singleton(this->body->firstSet);
      pLabel_00 = (TryMixin *)(puVar14 + 3);
      if ((char)iVar11 == '\0') {
        *puVar14 = '\x04';
        *(char16 *)(puVar14 + 1) = cVar9;
        puVar14[3] = 0xff;
        puVar14[4] = 0xff;
        puVar14[5] = 0xff;
        puVar14[6] = 0xff;
        goto LAB_00d16be9;
      }
      *puVar14 = '\x05';
      *(char16 *)(puVar14 + 1) = cVar9;
      puVar14[3] = 0xff;
      puVar14[4] = 0xff;
      puVar14[5] = 0xff;
      puVar14[6] = 0xff;
    }
    else {
      this_02 = (MatchSetOrJumpInst *)Compiler::Emit(compiler,0x2d);
      pLabel_00 = (TryMixin *)&this_02->super_JumpMixin;
      if ((char)iVar11 == '\0') {
        JumpIfNotSetInst::JumpIfNotSetInst((JumpIfNotSetInst *)this_02);
        RuntimeCharSet<char16_t>::CloneFrom
                  (&(this_02->super_SetMixin<false>).set,compiler->rtAllocator,this->body->firstSet)
        ;
        goto LAB_00d16be9;
      }
      MatchSetOrJumpInst::MatchSetOrJumpInst(this_02);
      RuntimeCharSet<char16_t>::CloneFrom
                (&(this_02->super_SetMixin<false>).set,compiler->rtAllocator,this->body->firstSet);
    }
LAB_00d16ba3:
    LVar12 = Compiler::GetFixup(compiler,&pLabel_00->failLabel);
    maxBodyGroupId = 1;
    goto LAB_00d16bf1;
  case Try:
    pNVar15 = this->body;
    if (((pNVar15->features & 0x100) != 0) && ((pNVar15->thisConsumes).lower == 0)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar13 = 1;
      bVar8 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/RegexCompileTime.cpp"
                         ,0x1052,
                         "(!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty())",
                         "!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty()");
      if (!bVar8) goto LAB_00d16c34;
      *puVar13 = 0;
      pNVar15 = this->body;
    }
    maxBodyGroupId = 0;
    if ((pNVar15->thisConsumes).lower == 0) {
LAB_00d168f6:
      puVar14 = Compiler::Emit(compiler,5);
      *puVar14 = ']';
      puVar14[1] = 0xff;
      puVar14[2] = 0xff;
      puVar14[3] = 0xff;
      puVar14[4] = 0xff;
      pLabel_00 = (TryMixin *)(puVar14 + 1);
    }
    else {
      if ((pNVar15->field_0xc & 1) == 0) {
        uVar10 = CharSet<char16_t>::Count(pNVar15->firstSet);
        if (0x14 < uVar10) goto LAB_00d168f6;
        pNVar15 = this->body;
      }
      iVar11 = (*pNVar15->_vptr_Node[0xb])(pNVar15,compiler);
      sVar5 = (this->body->firstSet->rep).compact.countPlusOne;
      if ((char)iVar11 != '\0') {
        if (sVar5 == 2) {
          puVar14 = Compiler::Emit(compiler,7);
          cVar9 = CharSet<char16_t>::Singleton(this->body->firstSet);
          *puVar14 = '_';
          *(char16 *)(puVar14 + 1) = cVar9;
          puVar14[3] = 0xff;
          puVar14[4] = 0xff;
          puVar14[5] = 0xff;
          puVar14[6] = 0xff;
          pLabel_00 = (TryMixin *)(puVar14 + 3);
        }
        else {
          this_05 = (TryMatchSetInst *)Compiler::Emit(compiler,0x2d);
          TryMatchSetInst::TryMatchSetInst(this_05);
          RuntimeCharSet<char16_t>::CloneFrom
                    (&(this_05->super_SetMixin<false>).set,compiler->rtAllocator,
                     this->body->firstSet);
          pLabel_00 = &this_05->super_TryMixin;
        }
        goto LAB_00d16ba3;
      }
      if (sVar5 == 2) {
        puVar14 = Compiler::Emit(compiler,7);
        cVar9 = CharSet<char16_t>::Singleton(this->body->firstSet);
        *puVar14 = '^';
        *(char16 *)(puVar14 + 1) = cVar9;
        puVar14[3] = 0xff;
        puVar14[4] = 0xff;
        puVar14[5] = 0xff;
        puVar14[6] = 0xff;
        pLabel_00 = (TryMixin *)(puVar14 + 3);
      }
      else {
        this_06 = (TryIfSetInst *)Compiler::Emit(compiler,0x2d);
        TryIfSetInst::TryIfSetInst(this_06);
        RuntimeCharSet<char16_t>::CloneFrom
                  (&(this_06->super_SetMixin<false>).set,compiler->rtAllocator,this->body->firstSet)
        ;
        pLabel_00 = &this_06->super_TryMixin;
      }
    }
LAB_00d16be9:
    LVar12 = Compiler::GetFixup(compiler,&pLabel_00->failLabel);
LAB_00d16bf1:
    (*this->body->_vptr_Node[0x11])(this->body,compiler,&maxBodyGroupId);
    LVar19 = compiler->instNext;
    goto LAB_00d16c0e;
  }
  this_07 = &(this_03->super_LoopSetInst).super_SetMixin<false>.set;
LAB_00d16a83:
  allocator = compiler->rtAllocator;
  other = this->body->firstSet;
LAB_00d16a92:
  RuntimeCharSet<char16_t>::CloneFrom(this_07,allocator,other);
  return;
}

Assistant:

void LoopNode::Emit(Compiler& compiler, CharCount& skipped)
    {
        PROBE_STACK_NO_DISPOSE(compiler.scriptContext, Js::Constants::MinStackRegex);

        Assert(skipped == 0);

        switch (scheme)
        {
            case BeginEnd:
            {
                //
                // Compilation scheme:
                //
                //   Lloop: BeginLoop Lexit
                //          <loop body>
                //          RepeatLoop Lloop
                //   Lexit:
                //
                int minBodyGroupId = compiler.program->numGroups;
                int maxBodyGroupId = -1;
                body->AccumDefineGroups(compiler.scriptContext, minBodyGroupId, maxBodyGroupId);
                Label beginLabel = compiler.CurrentLabel();
                Label fixup = compiler.GetFixup(&EMIT(compiler, BeginLoopInst, compiler.NextLoopId(), repeats, !isNotInLoop, !body->isDeterministic, minBodyGroupId, maxBodyGroupId, isGreedy)->exitLabel);
                body->Emit(compiler, skipped);
                EMIT(compiler, RepeatLoopInst, beginLabel);
                compiler.DoFixup(fixup, compiler.CurrentLabel());
                break;
            }

            case None:
            {
                // Nothing to emit
                break;
            }

            case Chomp:
            {
                //
                // Compilation scheme:
                //
                //   Chomp(Char|Set)(Star|Plus|Bounded)
                //
                if(body->firstSet->IsSingleton())
                {
                    if(repeats.lower <= 1 && repeats.IsUnbounded())
                    {
                        if(repeats.lower == 0)
                            EMIT(compiler, ChompCharInst<ChompMode::Star>, body->firstSet->Singleton());
                        else
                            EMIT(compiler, ChompCharInst<ChompMode::Plus>, body->firstSet->Singleton());
                    }
                    else
                        EMIT(compiler, ChompCharBoundedInst, body->firstSet->Singleton(), repeats);
                }
                else
                {
                    if(repeats.lower <= 1 && repeats.IsUnbounded())
                    {
                        if(repeats.lower == 0)
                            EMIT(compiler, ChompSetInst<ChompMode::Star>)->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                        else
                            EMIT(compiler, ChompSetInst<ChompMode::Plus>)->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                    }
                    else
                        EMIT(compiler, ChompSetBoundedInst, repeats)->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                }
                break;
            }

            case ChompGroupLastChar:
            {
                //
                // Compilation scheme:
                //
                //   ChompSetGroup
                //
                Assert(body->tag == DefineGroup);
                DefineGroupNode* bodyGroup = (DefineGroupNode*)body;
                EMIT(compiler, ChompSetBoundedGroupLastCharInst, repeats, bodyGroup->groupId, noNeedToSave)->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                break;
            }

            case Guarded:
            {
                //
                // Compilation scheme:
                //
                //   Lloop: BeginLoopIf(Char|Set) Lexit
                //          <loop body>
                //          RepeatLoopIf(Char|Set) Lloop
                //   Lexit:
                //
                int minBodyGroupId = compiler.program->numGroups;
                int maxBodyGroupId = -1;
                body->AccumDefineGroups(compiler.scriptContext, minBodyGroupId, maxBodyGroupId);
                Label beginLabel = compiler.CurrentLabel();
                Label exitFixup;
                if (body->firstSet->IsSingleton())
                    exitFixup = compiler.GetFixup(&EMIT(compiler, BeginLoopIfCharInst, body->firstSet->Singleton(), compiler.NextLoopId(), repeats, !isNotInLoop, !body->isDeterministic, minBodyGroupId, maxBodyGroupId)->exitLabel);
                else
                {
                    BeginLoopIfSetInst* i = EMIT(compiler, BeginLoopIfSetInst, compiler.NextLoopId(), repeats, !isNotInLoop, !body->isDeterministic, minBodyGroupId, maxBodyGroupId);
                    i->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                    exitFixup = compiler.GetFixup(&i->exitLabel);
                }
                body->Emit(compiler, skipped);
                if (body->firstSet->IsSingleton())
                    EMIT(compiler, RepeatLoopIfCharInst, beginLabel);
                else
                    EMIT(compiler, RepeatLoopIfSetInst, beginLabel);
                compiler.DoFixup(exitFixup, compiler.CurrentLabel());
                break;
            }

            case Fixed:
            {
                //
                // Compilation scheme:
                //
                //   Lloop: BeginLoopFixed Lexit
                //          <loop body>
                //          RepeatLoopFixed Lloop
                //   Lexit:
                //
                Assert(!body->ContainsDefineGroup());
                Assert(body->thisConsumes.IsFixed());
                Assert(body->thisConsumes.lower > 0);
                Assert(body->isDeterministic);
                Label beginLabel = compiler.CurrentLabel();
                Label fixup = compiler.GetFixup(&EMIT(compiler, BeginLoopFixedInst, compiler.NextLoopId(), repeats, !isNotInLoop, body->thisConsumes.lower)->exitLabel);
                body->Emit(compiler, skipped);
                EMIT(compiler, RepeatLoopFixedInst, beginLabel);
                compiler.DoFixup(fixup, compiler.CurrentLabel());
                break;
            }

            case FixedSet:
            {
                //
                // Compilation scheme:
                //
                //   LoopSet
                //
                Assert(body->IsSimpleOneChar());
                if (followFirst == MaxChar || PHASE_OFF1(Js::RegexOptBTPhase))
                {
                    EMIT(compiler, LoopSetInst, compiler.NextLoopId(), repeats, !isNotInLoop)->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                }
                else
                {
                    EMIT(compiler, LoopSetWithFollowFirstInst, compiler.NextLoopId(), repeats, !isNotInLoop, followFirst)->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                }
                break;
            }

            case FixedGroupLastIteration:
            {
                //
                // Compilation scheme:
                //
                //   Lloop: BeginLoopFixedGroupLastIteration Lexit
                //          <loop body>
                //          RepeatLoopFixedGroupLastIteration Lloop
                //   Lexit:
                //
                Assert(body->tag == DefineGroup);
                DefineGroupNode* bodyGroup = (DefineGroupNode*)body;
                Assert(body->thisConsumes.IsFixed());
                Assert(body->thisConsumes.lower > 0);
                Assert(body->isDeterministic);
                Label beginLabel = compiler.CurrentLabel();
                Label fixup = compiler.GetFixup(&EMIT(compiler, BeginLoopFixedGroupLastIterationInst, compiler.NextLoopId(), repeats, !isNotInLoop, body->thisConsumes.lower, bodyGroup->groupId, noNeedToSave)->exitLabel);
                bodyGroup->body->Emit(compiler, skipped);
                EMIT(compiler, RepeatLoopFixedGroupLastIterationInst, beginLabel);
                compiler.DoFixup(fixup, compiler.CurrentLabel());
                break;
            }

            case GreedyNoBacktrack:
            {
                //
                // Compilation scheme:
                //
                //   Lloop: BeginGreedyLoopNoBacktrack Lexit
                //          <loop body>
                //          RepeatGreedyLoopNoBacktrack Lloop
                //   Lexit:
                //
                Assert(!body->ContainsDefineGroup());
                Assert(isGreedy);
                Assert(repeats.lower == 0);
                Assert(repeats.upper == CharCountFlag);
                Assert(body->isDeterministic);
                Label beginLabel = compiler.CurrentLabel();
                Label fixup = compiler.GetFixup(&EMIT(compiler, BeginGreedyLoopNoBacktrackInst, compiler.NextLoopId())->exitLabel);
                body->Emit(compiler, skipped);
                EMIT(compiler, RepeatGreedyLoopNoBacktrackInst, beginLabel);
                compiler.DoFixup(fixup, compiler.CurrentLabel());
                break;
            }

            case Set:
            {
                //
                // Compilation scheme:
                //
                //   OptMatch(Char|Set)
                //
                Assert(!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty());
                if (body->firstSet->IsSingleton())
                    EMIT(compiler, OptMatchCharInst, body->firstSet->Singleton());
                else
                    EMIT(compiler, OptMatchSetInst)->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                break;
            }

            case Chain:
            {
                //
                // Compilation scheme:
                //
                //          JumpIfNot(Char|Set) Lexit
                //          <body>
                //   Lexit:
                //
                //
                Assert(!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty());
                Label jumpFixup = 0;
                CharCount bodySkipped = 0;
                if (body->firstSet->IsSingleton())
                {
                    if (body->SupportsPrefixSkipping(compiler))
                    {
                        jumpFixup = compiler.GetFixup(&EMIT(compiler, MatchCharOrJumpInst, body->firstSet->Singleton())->targetLabel);
                        bodySkipped = 1;
                    }
                    else
                        jumpFixup = compiler.GetFixup(&EMIT(compiler, JumpIfNotCharInst, body->firstSet->Singleton())->targetLabel);
                }
                else
                {
                    if (body->SupportsPrefixSkipping(compiler))
                    {
                        MatchSetOrJumpInst* const i = EMIT(compiler, MatchSetOrJumpInst);
                        i->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                        jumpFixup = compiler.GetFixup(&i->targetLabel);
                        bodySkipped = 1;
                    }
                    else
                    {
                        JumpIfNotSetInst* const i = EMIT(compiler, JumpIfNotSetInst);
                        i->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                        jumpFixup = compiler.GetFixup(&i->targetLabel);
                    }
                }
                body->Emit(compiler, bodySkipped);
                compiler.DoFixup(jumpFixup, compiler.CurrentLabel());
                break;
            }

            case Try:
            {
                //
                // Compilation scheme:
                //
                //          Try((If|Match)(Char|Set))? Lexit
                //          <loop body>
                //   Lexit:
                //
                Assert(!body->ContainsDefineGroup() || !body->thisConsumes.CouldMatchEmpty());
                Label tryFixup = 0;
                CharCount bodySkipped = 0;
                // HEURISTIC: if the first set of the body is exact or small, and the
                //            body does not match empty, then it's probably worth using
                //            a Try(If|Match)(Char|Set)
                if (!body->thisConsumes.CouldMatchEmpty() &&
                    (body->isFirstExact || body->firstSet->Count() <= maxCharsForConditionalTry))
                {
                    if (body->SupportsPrefixSkipping(compiler))
                    {
                        if (body->firstSet->IsSingleton())
                            tryFixup = compiler.GetFixup(&EMIT(compiler, TryMatchCharInst, body->firstSet->Singleton())->failLabel);
                        else
                        {
                            TryMatchSetInst* const i = EMIT(compiler, TryMatchSetInst);
                            i->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                            tryFixup = compiler.GetFixup(&i->failLabel);
                        }
                        bodySkipped = 1;
                    }
                    else
                    {
                        if(body->firstSet->IsSingleton())
                            tryFixup = compiler.GetFixup(&EMIT(compiler, TryIfCharInst, body->firstSet->Singleton())->failLabel);
                        else
                        {
                            TryIfSetInst* const i = EMIT(compiler, TryIfSetInst);
                            i->set.CloneFrom(compiler.rtAllocator, *body->firstSet);
                            tryFixup = compiler.GetFixup(&i->failLabel);
                        }
                    }
                }
                else
                    tryFixup = compiler.GetFixup(&EMIT(compiler, TryInst)->failLabel);
                body->Emit(compiler, bodySkipped);
                // Fixup Try
                compiler.DoFixup(tryFixup, compiler.CurrentLabel());
                break;
            }
        }
    }